

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O3

istream * __thiscall nivalis::Plotter::import_json(Plotter *this,istream *is,string *error_msg)

{
  vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_> *this_00;
  value_t vVar1;
  Function *pFVar2;
  Function *pFVar3;
  double dVar4;
  float __val;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  t;
  json_value jVar5;
  vector<nivalis::Function,_std::allocator<nivalis::Function>_> *pvVar6;
  char cVar7;
  bool bVar8;
  uint64_t uVar9;
  size_type sVar10;
  reference pvVar11;
  reference pbVar12;
  ostream *poVar13;
  reference pvVar14;
  undefined8 *puVar15;
  pointer pFVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  Function *this_01;
  int width;
  uint uVar20;
  char cVar21;
  size_t sVar22;
  pointer pFVar23;
  string sVar24;
  uint __len;
  int height;
  long lVar25;
  Environment *color_index;
  istream *piVar26;
  initializer_list_t init;
  initializer_list_t init_00;
  json j;
  iterator __begin3;
  double ret_9;
  ostringstream ss;
  Shell tmpshell;
  undefined1 local_2a8 [8];
  json_value local_2a0;
  undefined1 local_298 [8];
  json_value local_290;
  iterator iStack_288;
  json_value local_280;
  primitive_iterator_t local_278;
  undefined1 local_268 [32];
  primitive_iterator_t local_248;
  Environment *local_240;
  vector<nivalis::Function,_std::allocator<nivalis::Function>_> *local_238;
  undefined1 local_230 [32];
  primitive_iterator_t local_210;
  istream *local_208;
  undefined1 local_200 [8];
  json_value local_1f8;
  undefined1 auStack_1f0 [16];
  primitive_iterator_t local_1e0;
  json_value local_1d8 [8];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_1d0;
  undefined1 local_1c8;
  ios_base local_190 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  json_value local_38;
  
  if (error_msg != (string *)0x0) {
    error_msg->_M_string_length = 0;
    *(error_msg->_M_dataplus)._M_p = '\0';
  }
  pFVar2 = (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pFVar3 = (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  this_01 = pFVar2;
  local_68 = error_msg;
  if (pFVar3 != pFVar2) {
    do {
      Function::~Function(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != pFVar3);
    (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
    super__Vector_impl_data._M_finish = pFVar2;
  }
  local_2a8[0] = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  )0x0;
  local_2a0.object = (object_t *)0x0;
  local_208 = is;
  nlohmann::operator>>
            (is,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_2a8);
  if (local_2a8[0] ==
      (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       )0x2) {
    local_1f8.object = (object_t *)0x0;
    local_200[0] = (string)0x3;
    local_1f8.object =
         (object_t *)
         nlohmann::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
         ::create<std::__cxx11::string,char_const(&)[6]>((char (*) [6])0x229c3e);
    auStack_1f0._0_8_ = local_200;
    auStack_1f0[8] = true;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&local_1e0,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)local_2a8);
    local_1c8 = 1;
    init._M_len = 2;
    init._M_array = (iterator)local_200;
    local_1d0 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&local_1e0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)local_298,init,true,array);
    local_280.boolean = true;
    init_00._M_len = 1;
    init_00._M_array = (iterator)local_298;
    iStack_288._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)local_298;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)local_40,init_00,true,array);
    jVar5 = local_2a0;
    t = local_2a8[0];
    local_2a8[0] = local_40[0];
    local_40[0] = t;
    local_2a0 = local_38;
    local_38 = jVar5;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::json_value::destroy((json_value *)(local_40 + 8),(value_t)t);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::json_value::destroy((json_value *)&local_290.boolean,local_298[0]);
    lVar25 = 0;
    do {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::json_value::destroy(local_1d8 + lVar25,(value_t)local_1d8[lVar25 + -8]);
      lVar25 = lVar25 + -0x20;
    } while (lVar25 != -0x40);
  }
  local_240 = &this->env;
  Environment::clear(local_240);
  local_200 = (undefined1  [8])auStack_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"x","");
  uVar9 = Environment::addr_of(local_240,(string *)local_200,false);
  this->x_var = (uint32_t)uVar9;
  if (local_200 != (undefined1  [8])auStack_1f0) {
    operator_delete((void *)local_200,(ulong)(auStack_1f0._0_8_ + 1));
  }
  local_200 = (undefined1  [8])auStack_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"y","");
  uVar9 = Environment::addr_of(local_240,(string *)local_200,false);
  this->y_var = (uint32_t)uVar9;
  if (local_200 != (undefined1  [8])auStack_1f0) {
    operator_delete((void *)local_200,(ulong)(auStack_1f0._0_8_ + 1));
  }
  local_200 = (undefined1  [8])auStack_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"t","");
  uVar9 = Environment::addr_of(local_240,(string *)local_200,false);
  this->t_var = (uint32_t)uVar9;
  if (local_200 != (undefined1  [8])auStack_1f0) {
    operator_delete((void *)local_200,(ulong)(auStack_1f0._0_8_ + 1));
  }
  local_200 = (undefined1  [8])auStack_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"r","");
  uVar9 = Environment::addr_of(local_240,(string *)local_200,false);
  this->r_var = (uint32_t)uVar9;
  if (local_200 != (undefined1  [8])auStack_1f0) {
    operator_delete((void *)local_200,(ulong)(auStack_1f0._0_8_ + 1));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
  Shell::Shell((Shell *)&local_88,local_240,(ostream *)local_200);
  if (((local_2a8[0] ==
        (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
         )0x1) &&
      (sVar10 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                ::_M_count_tr<char[6],void>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                            *)local_2a0.object,(char (*) [6])"shell"), sVar10 != 0)) &&
     (pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_2a8,"shell"), pvVar11->m_type == array)) {
    local_298 = (undefined1  [8])
                nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_2a8,"shell");
    local_290.object = (object_t *)0x0;
    iStack_288._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)0x0;
    local_280.object = (object_t *)0x0;
    local_278.m_it = -0x8000000000000000;
    vVar1 = ((reference)local_298)->m_type;
    if (vVar1 == null) {
      local_278.m_it = 1;
LAB_0012dffc:
      local_268._8_8_ = (_Base_ptr)0x0;
      local_268._16_8_ = (pointer)0x0;
      local_248.m_it = 1;
    }
    else if (vVar1 == array) {
      iStack_288._M_current =
           (((((reference)local_298)->m_value).array)->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_268._8_8_ = (_Base_ptr)0x0;
      local_248.m_it = -0x8000000000000000;
      local_268._16_8_ =
           (((((reference)local_298)->m_value).array)->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (vVar1 != object) {
        local_278.m_it = 0;
        goto LAB_0012dffc;
      }
      local_290 = (json_value)
                  (((((reference)local_298)->m_value).object)->_M_t)._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
      local_268._16_8_ = (pointer)0x0;
      local_248.m_it = -0x8000000000000000;
      local_268._8_8_ =
           &(((((reference)local_298)->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    local_268._24_8_ = (uchar *)0x0;
    local_268._0_8_ = local_298;
    while (bVar8 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_298,
                                (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)local_268), !bVar8) {
      pbVar12 = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)local_298);
      if (pbVar12->m_type == string) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_60,pbVar12);
        bVar8 = Shell::eval_line((Shell *)&local_88,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if (!bVar8) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"json_load_err ",0xe);
          std::__cxx11::stringbuf::str();
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)local_230._0_8_,local_230._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
          if ((reference)local_230._0_8_ != (reference)(local_230 + 0x10)) {
            operator_delete((void *)local_230._0_8_,(ulong)(local_230._16_8_ + 1));
          }
        }
      }
      if (*(value_t *)local_298 == array) {
        iStack_288._M_current = iStack_288._M_current + 1;
      }
      else if (*(value_t *)local_298 == object) {
        local_290.string = (string_t *)std::_Rb_tree_increment(local_290.string);
      }
      else {
        local_278.m_it = local_278.m_it + 1;
      }
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
  std::ios_base::~ios_base(local_190);
  this->polar_grid = false;
  this->enable_axes = true;
  this->enable_grid = true;
  if (((local_2a8[0] ==
        (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
         )0x1) &&
      (sVar10 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                ::_M_count_tr<char[5],void>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                            *)local_2a0.object,(char (*) [5])0x1ff395), sVar10 != 0)) &&
     (pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_2a8,"view"), pvVar11->m_type == object)) {
    sVar10 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
             ::_M_count_tr<char[5],void>
                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                         *)(pvVar11->m_value).object,(char (*) [5])"xmin");
    if (sVar10 != 0) {
      pvVar14 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar11,"xmin");
      nlohmann::detail::
      get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                (pvVar14,(double *)local_200);
      (this->view).xmin = (double)local_200;
    }
    if (pvVar11->m_type == object) {
      sVar10 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
               ::_M_count_tr<char[5],void>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                           *)(pvVar11->m_value).object,(char (*) [5])"xmax");
      if (sVar10 != 0) {
        pvVar14 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar11,"xmax");
        nlohmann::detail::
        get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                  (pvVar14,(double *)local_200);
        (this->view).xmax = (double)local_200;
      }
      if (pvVar11->m_type != object) goto LAB_0012e339;
      sVar10 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
               ::_M_count_tr<char[5],void>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                           *)(pvVar11->m_value).object,(char (*) [5])"xmin");
      if (sVar10 != 0) {
        pvVar14 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar11,"ymin");
        nlohmann::detail::
        get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                  (pvVar14,(double *)local_200);
        (this->view).ymin = (double)local_200;
      }
      if (pvVar11->m_type != object) goto LAB_0012e339;
      sVar10 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
               ::_M_count_tr<char[5],void>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                           *)(pvVar11->m_value).object,(char (*) [5])"xmax");
      if (sVar10 != 0) {
        pvVar14 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar11,"ymax");
        nlohmann::detail::
        get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                  (pvVar14,(double *)local_200);
        (this->view).ymax = (double)local_200;
      }
      width = (this->view).swid;
      height = (this->view).shigh;
      if ((pvVar11->m_type == object) &&
         (sVar10 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_count_tr<char[6],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(pvVar11->m_value).object,(char (*) [6])"width"), sVar10 != 0)) {
        pvVar14 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar11,"width");
        nlohmann::detail::
        get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                  (pvVar14,(double *)local_200);
        (this->view).swid = (int)(double)local_200;
      }
    }
    else {
LAB_0012e339:
      width = (this->view).swid;
      height = (this->view).shigh;
    }
    if ((pvVar11->m_type == object) &&
       (sVar10 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                 ::_M_count_tr<char[7],void>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                             *)(pvVar11->m_value).object,(char (*) [7])"height"), sVar10 != 0)) {
      pvVar14 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)pvVar11,"height");
      nlohmann::detail::
      get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                (pvVar14,(double *)local_200);
      (this->view).shigh = (int)(double)local_200;
    }
    resize(this,width,height);
    if (pvVar11->m_type == object) {
      sVar10 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
               ::_M_count_tr<char[5],void>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                           *)(pvVar11->m_value).object,(char (*) [5])"axes");
      if (sVar10 != 0) {
        pvVar14 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar11,"axes");
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar14,(boolean_t *)local_200);
        this->enable_axes = (bool)local_200[0];
      }
      if (pvVar11->m_type == object) {
        sVar10 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                 ::_M_count_tr<char[5],void>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                             *)(pvVar11->m_value).object,(char (*) [5])0x1fffbb);
        if (sVar10 != 0) {
          pvVar14 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)pvVar11,"grid");
          nlohmann::detail::
          from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (pvVar14,(boolean_t *)local_200);
          this->enable_grid = (bool)local_200[0];
        }
        if ((pvVar11->m_type == object) &&
           (sVar10 = std::
                     _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                     ::_M_count_tr<char[6],void>
                               ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                 *)(pvVar11->m_value).object,(char (*) [6])0x22b9f7), sVar10 != 0))
        {
          pvVar11 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)pvVar11,"polar");
          nlohmann::detail::
          from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (pvVar11,(boolean_t *)local_200);
          this->polar_grid = (bool)local_200[0];
        }
      }
    }
  }
  this_00 = &this->sliders;
  std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>::_M_erase_at_end
            (this_00,(this->sliders).
                     super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->sliders_vars)._M_t);
  local_238 = &this->funcs;
  if (local_2a8[0] ==
      (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       )0x1) {
    sVar10 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
             ::_M_count_tr<char[8],void>
                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                         *)local_2a0.object,(char (*) [8])"sliders");
    if ((sVar10 != 0) &&
       (pvVar11 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)local_2a8,"sliders"), pvVar11->m_type == array)) {
      local_298 = (undefined1  [8])
                  nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)local_2a8,"sliders");
      local_1f8.object = (object_t *)0x0;
      auStack_1f0._0_8_ = (pointer)0x0;
      auStack_1f0._8_8_ = 0;
      local_1e0.m_it = -0x8000000000000000;
      vVar1 = ((reference)local_298)->m_type;
      if (vVar1 == null) {
        local_1e0.m_it = 1;
LAB_0012e5ae:
        local_290.object = (object_t *)0x0;
        iStack_288._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)0x0;
        local_278.m_it = 1;
      }
      else if (vVar1 == array) {
        auStack_1f0._0_8_ =
             (((((reference)local_298)->m_value).array)->
             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_290.object = (object_t *)0x0;
        local_278.m_it = -0x8000000000000000;
        iStack_288._M_current =
             (((((reference)local_298)->m_value).array)->
             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        if (vVar1 != object) {
          local_1e0.m_it = 0;
          goto LAB_0012e5ae;
        }
        local_1f8 = (json_value)
                    (((((reference)local_298)->m_value).object)->_M_t)._M_impl.super__Rb_tree_header
                    ._M_header._M_left;
        iStack_288._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)0x0;
        local_278.m_it = -0x8000000000000000;
        local_290.object =
             (object_t *)
             &(((((reference)local_298)->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
      }
      local_280.object = (object_t *)0x0;
      local_200 = local_298;
      while (bVar8 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)local_200,
                                  (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)local_298), !bVar8) {
        pbVar12 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)local_200);
        if (pbVar12->m_type == object) {
          lVar25 = (long)(this->sliders).
                         super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->sliders).
                         super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>::emplace_back<>
                    (this_00);
          if (pbVar12->m_type == object) {
            sVar10 = std::
                     _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                     ::_M_count_tr<char[4],void>
                               ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                 *)(pbVar12->m_value).object,(char (*) [4])0x1ff2d1);
            if (sVar10 != 0) {
              pvVar11 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                    *)pbVar12,"min");
              nlohmann::detail::
              get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                        (pvVar11,(double *)local_268);
              *(float *)((long)(this_00->
                               super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar25 + 0x24) =
                   (float)(double)local_268._0_8_;
            }
            if (pbVar12->m_type == object) {
              sVar10 = std::
                       _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                       ::_M_count_tr<char[4],void>
                                 ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                   *)(pbVar12->m_value).object,(char (*) [4])0x1ff2e6);
              if (sVar10 != 0) {
                pvVar11 = nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                      *)pbVar12,"max");
                nlohmann::detail::
                get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                          (pvVar11,(double *)local_268);
                *(float *)((long)(this_00->
                                 super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar25 + 0x28) =
                     (float)(double)local_268._0_8_;
              }
              if (pbVar12->m_type == object) {
                sVar10 = std::
                         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                         ::_M_count_tr<char[4],void>
                                   ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                     *)(pbVar12->m_value).object,(char (*) [4])0x22bce0);
                if (sVar10 != 0) {
                  pvVar11 = nlohmann::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ::operator[]<char_const>
                                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                        *)pbVar12,"val");
                  nlohmann::detail::
                  get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                            (pvVar11,(double *)local_268);
                  *(float *)((long)(this_00->
                                   super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>
                                   )._M_impl.super__Vector_impl_data._M_start + lVar25 + 0x20) =
                       (float)(double)local_268._0_8_;
                }
                if ((pbVar12->m_type == object) &&
                   (sVar10 = std::
                             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                             ::_M_count_tr<char[4],void>
                                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                         *)(pbVar12->m_value).object,(char (*) [4])"var"),
                   sVar10 != 0)) {
                  pvVar11 = nlohmann::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ::operator[]<char_const>
                                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                        *)pbVar12,"var");
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::
                  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_268,pvVar11);
                  std::__cxx11::string::operator=
                            ((string *)
                             ((long)(this_00->
                                    super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>
                                    )._M_impl.super__Vector_impl_data._M_start + lVar25),
                             (string *)local_268);
                  if ((reference)local_268._0_8_ != (reference)(local_268 + 0x10)) {
                    operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
                  }
                  update_slider_var(this,(lVar25 >> 3) * 0x2e8ba2e8ba2e8ba3);
                  if ((pbVar12->m_type != object) ||
                     (sVar10 = std::
                               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               ::_M_count_tr<char[4],void>
                                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                           *)(pbVar12->m_value).object,(char (*) [4])0x22bce0),
                     sVar10 == 0)) {
                    dVar4 = Environment::get(local_240,
                                             (string *)
                                             ((long)(this_00->
                                                                                                        
                                                  super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                             lVar25));
                    *(float *)((long)(this_00->
                                     super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>
                                     )._M_impl.super__Vector_impl_data._M_start + lVar25 + 0x20) =
                         (float)dVar4;
                  }
                }
              }
            }
          }
        }
        if (*(char *)local_200 == '\x02') {
          auStack_1f0._0_8_ = auStack_1f0._0_8_ + 0x10;
        }
        else if (*(char *)local_200 == '\x01') {
          local_1f8.string = (string_t *)std::_Rb_tree_increment(local_1f8.string);
        }
        else {
          local_1e0.m_it = local_1e0.m_it + 1;
        }
      }
    }
    if (((local_2a8[0] !=
          (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           )0x1) ||
        (sVar10 = std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                  ::_M_count_tr<char[6],void>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                              *)local_2a0.object,(char (*) [6])0x229c3e), sVar10 == 0)) ||
       (pvVar11 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)local_2a8,"funcs"), pvVar11->m_type != array)) goto LAB_0012e8e7;
    local_268._0_8_ =
         nlohmann::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
         ::operator[]<char_const>
                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     *)local_2a8,"funcs");
    local_268._8_8_ = (_Base_ptr)0x0;
    local_268._16_8_ = (pointer)0x0;
    local_268._24_8_ = (uchar *)0x0;
    local_248.m_it = -0x8000000000000000;
    vVar1 = ((reference)local_268._0_8_)->m_type;
    if (vVar1 == null) {
      local_248.m_it = 1;
LAB_0012ecf6:
      local_230._8_8_ = (_Base_ptr)0x0;
      local_230._16_8_ = (pointer)0x0;
      local_210.m_it = 1;
    }
    else if (vVar1 == array) {
      local_268._16_8_ =
           (((((reference)local_268._0_8_)->m_value).array)->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_230._8_8_ = (_Base_ptr)0x0;
      local_210.m_it = -0x8000000000000000;
      local_230._16_8_ =
           (((((reference)local_268._0_8_)->m_value).array)->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (vVar1 != object) {
        local_248.m_it = 0;
        goto LAB_0012ecf6;
      }
      local_268._8_8_ =
           (((((reference)local_268._0_8_)->m_value).object)->_M_t)._M_impl.super__Rb_tree_header.
           _M_header._M_left;
      local_230._16_8_ = (pointer)0x0;
      local_210.m_it = -0x8000000000000000;
      local_230._8_8_ =
           &(((((reference)local_268._0_8_)->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    local_230._24_8_ = (uchar *)0x0;
    color_index = (Environment *)0x0;
    local_230._0_8_ = local_268._0_8_;
    while( true ) {
      bVar8 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_268,
                           (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_230);
      if (bVar8) break;
      pbVar12 = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)local_268);
      pvVar6 = local_238;
      std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::emplace_back<>(local_238);
      pFVar23 = (pvVar6->super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>).
                _M_impl.super__Vector_impl_data._M_start + (long)color_index;
      if (pbVar12->m_type == string) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                   pbVar12);
        std::__cxx11::string::operator=((string *)&pFVar23->expr_str,(string *)local_200);
        if (local_200 != (undefined1  [8])auStack_1f0) {
          operator_delete((void *)local_200,(ulong)(auStack_1f0._0_8_ + 1));
        }
        uVar19 = this->next_func_name;
        this->next_func_name = uVar19 + 1;
        cVar21 = '\x01';
        if (9 < uVar19) {
          uVar18 = uVar19;
          cVar7 = '\x04';
          do {
            cVar21 = cVar7;
            if (uVar18 < 100) {
              cVar21 = cVar21 + -2;
              goto LAB_0012f0fa;
            }
            if (uVar18 < 1000) {
              cVar21 = cVar21 + -1;
              goto LAB_0012f0fa;
            }
            if (uVar18 < 10000) goto LAB_0012f0fa;
            bVar8 = 99999 < uVar18;
            uVar18 = uVar18 / 10000;
            cVar7 = cVar21 + '\x04';
          } while (bVar8);
          cVar21 = cVar21 + '\x01';
        }
LAB_0012f0fa:
        local_298 = (undefined1  [8])&iStack_288;
        std::__cxx11::string::_M_construct((ulong)local_298,cVar21);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_298,local_290.number_unsigned._0_4_,uVar19);
        puVar15 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_298,0,(char *)0x0,0x25f392);
        pvVar11 = (reference)(puVar15 + 2);
        if ((reference)*puVar15 == pvVar11) {
          auStack_1f0._0_8_ = *(undefined8 *)pvVar11;
          auStack_1f0._8_8_ = puVar15[3];
          local_200 = (undefined1  [8])auStack_1f0;
        }
        else {
          auStack_1f0._0_8_ = *(undefined8 *)pvVar11;
          local_200 = (undefined1  [8])*puVar15;
        }
        local_1f8 = *(json_value *)(puVar15 + 1);
        *puVar15 = pvVar11;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        std::__cxx11::string::operator=((string *)pFVar23,(string *)local_200);
        if (local_200 != (undefined1  [8])auStack_1f0) {
          operator_delete((void *)local_200,(ulong)(auStack_1f0._0_8_ + 1));
        }
        if (local_298 != (undefined1  [8])&iStack_288) {
          operator_delete((void *)local_298,(ulong)&(iStack_288._M_current)->field_0x1);
        }
        color::from_int((color *)local_200,(size_t)color_index);
        color::color::operator=((color *)local_298,&pFVar23->line_color,(color *)local_200);
        this->last_expr_color =
             (size_t)((long)&(color_index->vars).super__Vector_base<double,_std::allocator<double>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1);
      }
      else if (pbVar12->m_type == object) {
        sVar10 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                 ::_M_count_tr<char[5],void>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                             *)(pbVar12->m_value).object,(char (*) [5])"expr");
        if (sVar10 != 0) {
          pvVar11 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)pbVar12,"expr");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                     pvVar11);
          std::__cxx11::string::operator=((string *)&pFVar23->expr_str,(string *)local_200);
          if (local_200 != (undefined1  [8])auStack_1f0) {
            operator_delete((void *)local_200,(ulong)(auStack_1f0._0_8_ + 1));
          }
        }
        if (pbVar12->m_type == object) {
          sVar10 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_count_tr<char[6],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(pbVar12->m_value).object,(char (*) [6])0x2291c6);
          if (sVar10 == 0) goto LAB_0012ef3c;
          pvVar11 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)pbVar12,"color");
          if (pvVar11->m_type == string) {
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_88,pvVar11);
            color::from_hex((color *)local_200,&local_88);
            color::color::operator=((color *)local_298,&pFVar23->line_color,(color *)local_200);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
          }
          else if ((byte)(pvVar11->m_type - number_integer) < 2) {
            nlohmann::detail::
            from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                      (pvVar11,(int *)local_298);
            color::from_int((color *)local_200,(long)(int)local_298._0_4_);
            color::color::operator=((color *)local_298,&pFVar23->line_color,(color *)local_200);
          }
        }
        else {
LAB_0012ef3c:
          color::from_int((color *)local_200,(size_t)color_index);
          color::color::operator=((color *)local_298,&pFVar23->line_color,(color *)local_200);
          this->last_expr_color =
               (size_t)((long)&(color_index->vars).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + 1);
        }
        if ((pbVar12->m_type == object) &&
           (sVar10 = std::
                     _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                     ::_M_count_tr<char[3],void>
                               ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                 *)(pbVar12->m_value).object,(char (*) [3])0x262ccb), sVar10 != 0))
        {
          local_240 = color_index;
          pvVar11 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)pbVar12,"id");
          nlohmann::detail::
          from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                    (pvVar11,(int *)local_200);
          uVar19 = (long)(int)local_200._0_4_ + 1U;
          if ((long)(int)local_200._0_4_ + 1U < this->next_func_name) {
            uVar19 = this->next_func_name;
          }
          this->next_func_name = uVar19;
          __val = (float)-local_200._0_4_;
          if (0 < (int)local_200._0_4_) {
            __val = (float)local_200._0_4_;
          }
          __len = 1;
          if (9 < (uint)__val) {
            uVar19 = (ulong)(uint)__val;
            uVar20 = 4;
            do {
              __len = uVar20;
              uVar17 = (uint)uVar19;
              if (uVar17 < 100) {
                __len = __len - 2;
                goto LAB_0012f31a;
              }
              if (uVar17 < 1000) {
                __len = __len - 1;
                goto LAB_0012f31a;
              }
              if (uVar17 < 10000) goto LAB_0012f31a;
              uVar19 = uVar19 / 10000;
              uVar20 = __len + 4;
            } while (99999 < uVar17);
            __len = __len + 1;
          }
LAB_0012f31a:
          uVar20 = (uint)local_200._0_4_ >> 0x1f;
          local_298 = (undefined1  [8])&iStack_288;
          std::__cxx11::string::_M_construct((ulong)local_298,(char)__len - (local_200[3] >> 7));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((value_t *)local_298 + uVar20),__len,(uint)__val);
          puVar15 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_298,0,(char *)0x0,0x25f392);
          pvVar11 = (reference)(puVar15 + 2);
          if ((reference)*puVar15 == pvVar11) {
            auStack_1f0._0_8_ = *(undefined8 *)pvVar11;
            auStack_1f0._8_8_ = puVar15[3];
            local_200 = (undefined1  [8])auStack_1f0;
          }
          else {
            auStack_1f0._0_8_ = *(undefined8 *)pvVar11;
            local_200 = (undefined1  [8])*puVar15;
          }
          local_1f8 = *(json_value *)(puVar15 + 1);
          *puVar15 = pvVar11;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          std::__cxx11::string::operator=((string *)pFVar23,(string *)local_200);
          if (local_200 != (undefined1  [8])auStack_1f0) {
            operator_delete((void *)local_200,(ulong)(auStack_1f0._0_8_ + 1));
          }
          color_index = local_240;
          if (local_298 != (undefined1  [8])&iStack_288) {
            operator_delete((void *)local_298,(ulong)&(iStack_288._M_current)->field_0x1);
          }
        }
        else {
          uVar19 = this->next_func_name;
          this->next_func_name = uVar19 + 1;
          cVar21 = '\x01';
          if (9 < uVar19) {
            uVar18 = uVar19;
            cVar7 = '\x04';
            do {
              cVar21 = cVar7;
              if (uVar18 < 100) {
                cVar21 = cVar21 + -2;
                goto LAB_0012f220;
              }
              if (uVar18 < 1000) {
                cVar21 = cVar21 + -1;
                goto LAB_0012f220;
              }
              if (uVar18 < 10000) goto LAB_0012f220;
              bVar8 = 99999 < uVar18;
              uVar18 = uVar18 / 10000;
              cVar7 = cVar21 + '\x04';
            } while (bVar8);
            cVar21 = cVar21 + '\x01';
          }
LAB_0012f220:
          local_298 = (undefined1  [8])&iStack_288;
          std::__cxx11::string::_M_construct((ulong)local_298,cVar21);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_298,local_290.number_unsigned._0_4_,uVar19);
          puVar15 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_298,0,(char *)0x0,0x25f392);
          pvVar11 = (reference)(puVar15 + 2);
          if ((reference)*puVar15 == pvVar11) {
            auStack_1f0._0_8_ = *(undefined8 *)pvVar11;
            auStack_1f0._8_8_ = puVar15[3];
            local_200 = (undefined1  [8])auStack_1f0;
          }
          else {
            auStack_1f0._0_8_ = *(undefined8 *)pvVar11;
            local_200 = (undefined1  [8])*puVar15;
          }
          local_1f8 = *(json_value *)(puVar15 + 1);
          *puVar15 = pvVar11;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          std::__cxx11::string::operator=((string *)pFVar23,(string *)local_200);
          if (local_200 != (undefined1  [8])auStack_1f0) {
            operator_delete((void *)local_200,(ulong)(auStack_1f0._0_8_ + 1));
          }
          if (local_298 != (undefined1  [8])&iStack_288) {
            operator_delete((void *)local_298,(ulong)&(iStack_288._M_current)->field_0x1);
          }
        }
        if (pbVar12->m_type == object) {
          sVar10 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                   ::_M_count_tr<char[5],void>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                               *)(pbVar12->m_value).object,(char (*) [5])0x1ff2d7);
          if (sVar10 != 0) {
            pvVar11 = nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  *)pbVar12,"tmin");
            nlohmann::detail::
            get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                      (pvVar11,(double *)local_200);
            pFVar23->tmin = (float)(double)local_200;
          }
          if ((pbVar12->m_type == object) &&
             (sVar10 = std::
                       _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                       ::_M_count_tr<char[5],void>
                                 ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                   *)(pbVar12->m_value).object,(char (*) [5])0x1ff2ec), sVar10 != 0)
             ) {
            pvVar11 = nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  *)pbVar12,"tmax");
            nlohmann::detail::
            get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                      (pvVar11,(double *)local_200);
            pFVar23->tmax = (float)(double)local_200;
          }
        }
      }
      color_index = (Environment *)
                    ((long)&(color_index->vars).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1);
      if (*(char *)local_268._0_8_ == '\x02') {
        local_268._16_8_ = local_268._16_8_ + 0x10;
      }
      else if (*(char *)local_268._0_8_ == '\x01') {
        local_268._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_268._8_8_);
      }
      else {
        local_248.m_it = local_248.m_it + 1;
      }
    }
  }
  else {
LAB_0012e8e7:
    std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::resize(local_238,1);
    pFVar23 = (local_238->super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::_M_replace
              ((ulong)&pFVar23->expr_str,0,(char *)(pFVar23->expr_str)._M_string_length,0x25f383);
    ((this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl
     .super__Vector_impl_data._M_start)->type = 0;
    sVar22 = this->last_expr_color;
    this->last_expr_color = sVar22 + 1;
    color::from_int((color *)local_200,sVar22);
    pvVar6 = local_238;
    color::color::operator=
              ((color *)local_298,
               &((local_238->
                 super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>)._M_impl.
                 super__Vector_impl_data._M_start)->line_color,(color *)local_200);
    uVar19 = this->next_func_name;
    this->next_func_name = uVar19 + 1;
    cVar21 = '\x01';
    if (9 < uVar19) {
      uVar18 = uVar19;
      cVar7 = '\x04';
      do {
        cVar21 = cVar7;
        if (uVar18 < 100) {
          cVar21 = cVar21 + -2;
          goto LAB_0012e9cf;
        }
        if (uVar18 < 1000) {
          cVar21 = cVar21 + -1;
          goto LAB_0012e9cf;
        }
        if (uVar18 < 10000) goto LAB_0012e9cf;
        bVar8 = 99999 < uVar18;
        uVar18 = uVar18 / 10000;
        cVar7 = cVar21 + '\x04';
      } while (bVar8);
      cVar21 = cVar21 + '\x01';
    }
LAB_0012e9cf:
    local_298 = (undefined1  [8])&iStack_288;
    std::__cxx11::string::_M_construct((ulong)local_298,cVar21);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_298,local_290.number_unsigned._0_4_,uVar19);
    puVar15 = (undefined8 *)std::__cxx11::string::replace((ulong)local_298,0,(char *)0x0,0x25f392);
    pvVar11 = (reference)(puVar15 + 2);
    if ((reference)*puVar15 == pvVar11) {
      auStack_1f0._0_8_ = *(undefined8 *)pvVar11;
      auStack_1f0._8_8_ = puVar15[3];
      local_200 = (undefined1  [8])auStack_1f0;
    }
    else {
      auStack_1f0._0_8_ = *(undefined8 *)pvVar11;
      local_200 = (undefined1  [8])*puVar15;
    }
    local_1f8 = *(json_value *)(puVar15 + 1);
    *puVar15 = pvVar11;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    std::__cxx11::string::operator=
              ((string *)
               (pvVar6->super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>).
               _M_impl.super__Vector_impl_data._M_start,(string *)local_200);
    if (local_200 != (undefined1  [8])auStack_1f0) {
      operator_delete((void *)local_200,(ulong)(auStack_1f0._0_8_ + 1));
    }
    if (local_298 != (undefined1  [8])&iStack_288) {
      operator_delete((void *)local_298,(ulong)&(iStack_288._M_current)->field_0x1);
    }
  }
  std::deque<nivalis::color::color,_std::allocator<nivalis::color::color>_>::clear
            (&this->reuse_colors);
  sVar24 = (string)0x0;
  if (local_2a8[0] ==
      (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       )0x1) {
    sVar10 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
             ::_M_count_tr<char[9],void>
                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                         *)local_2a0.object,(char (*) [9])"internal");
    if ((sVar10 != 0) &&
       (pvVar11 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)local_2a8,"internal"), pvVar11->m_type == object)) {
      sVar10 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
               ::_M_count_tr<char[10],void>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                           *)(pvVar11->m_value).object,(char (*) [10])"curr_func");
      if (sVar10 == 0) {
        set_curr_func(this,0);
      }
      else {
        pvVar14 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar11,"curr_func");
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                  (pvVar14,(int *)local_200);
        sVar22 = (size_t)(int)local_200._0_4_;
        if (((long)sVar22 < 0) ||
           (uVar19 = ((long)(this->funcs).
                            super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->funcs).
                            super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x79435e50d79435e5,
           uVar19 < sVar22 || uVar19 - sVar22 == 0)) {
          sVar22 = 0;
        }
        set_curr_func(this,sVar22);
      }
      if (pvVar11->m_type == object) {
        sVar10 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                 ::_M_count_tr<char[11],void>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                             *)(pvVar11->m_value).object,(char (*) [11])"next_color");
        if (sVar10 != 0) {
          pvVar14 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)pvVar11,"next_color");
          nlohmann::detail::
          get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                    (pvVar14,(double *)local_200);
          this->last_expr_color =
               (long)((double)local_200 - 9.223372036854776e+18) & (long)(double)local_200 >> 0x3f |
               (long)(double)local_200;
        }
        if (((pvVar11->m_type == object) &&
            (sVar10 = std::
                      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                      ::_M_count_tr<char[12],void>
                                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                  *)(pvVar11->m_value).object,(char (*) [12])"color_queue"),
            sVar10 != 0)) &&
           (pvVar14 = nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  *)pvVar11,"color_queue"), pvVar14->m_type == array)) {
          local_298 = (undefined1  [8])
                      nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  *)pvVar11,"color_queue");
          local_290.object = (object_t *)0x0;
          iStack_288._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x0;
          local_280.object = (object_t *)0x0;
          local_278.m_it = -0x8000000000000000;
          vVar1 = ((reference)local_298)->m_type;
          if (vVar1 == null) {
            local_278.m_it = 1;
LAB_0012f533:
            local_268._8_8_ = (_Base_ptr)0x0;
            local_268._16_8_ = (pointer)0x0;
            local_248.m_it = 1;
          }
          else if (vVar1 == array) {
            iStack_288._M_current =
                 (((((reference)local_298)->m_value).array)->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
            local_268._8_8_ = (_Base_ptr)0x0;
            local_248.m_it = -0x8000000000000000;
            local_268._16_8_ =
                 (((((reference)local_298)->m_value).array)->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            if (vVar1 != object) {
              local_278.m_it = 0;
              goto LAB_0012f533;
            }
            local_290 = (json_value)
                        (((((reference)local_298)->m_value).object)->_M_t)._M_impl.
                        super__Rb_tree_header._M_header._M_left;
            local_268._16_8_ = (pointer)0x0;
            local_248.m_it = -0x8000000000000000;
            local_268._8_8_ =
                 &(((((reference)local_298)->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
          }
          local_268._24_8_ = (uchar *)0x0;
          local_268._0_8_ = local_298;
          while (bVar8 = nlohmann::detail::
                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                       *)local_298,
                                      (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                       *)local_268), !bVar8) {
            pbVar12 = nlohmann::detail::
                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)local_298);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_230,pbVar12);
            color::from_hex((color *)local_200,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_230);
            std::deque<nivalis::color::color,_std::allocator<nivalis::color::color>_>::
            emplace_back<nivalis::color::color>(&this->reuse_colors,(color *)local_200);
            if ((reference)local_230._0_8_ != (reference)(local_230 + 0x10)) {
              operator_delete((void *)local_230._0_8_,(ulong)(local_230._16_8_ + 1));
            }
            if (*(value_t *)local_298 == array) {
              iStack_288._M_current = iStack_288._M_current + 1;
            }
            else if (*(value_t *)local_298 == object) {
              local_290.string = (string_t *)std::_Rb_tree_increment(local_290.string);
            }
            else {
              local_278.m_it = local_278.m_it + 1;
            }
          }
        }
      }
    }
    sVar24 = (string)0x0;
    if ((local_2a8[0] ==
         (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          )0x1) &&
       (sVar10 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                 ::_M_count_tr<char[6],void>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                             *)local_2a0.object,(char (*) [6])0x239efc), sVar24 = (string)0x0,
       sVar10 != 0)) {
      pvVar11 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)local_2a8,"latex");
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (pvVar11,(boolean_t *)local_200);
      sVar24 = local_200[0];
    }
  }
  if (sVar24 == (string)this->use_latex) {
    pFVar23 = (this->funcs).
              super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
              super__Vector_impl_data._M_start;
    pFVar16 = (this->funcs).
              super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  else {
    pFVar23 = (this->funcs).
              super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
              super__Vector_impl_data._M_start;
    pFVar16 = (this->funcs).
              super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
              super__Vector_impl_data._M_finish;
    piVar26 = local_208;
    if ((string)this->use_latex == (string)0x0) {
      if (pFVar16 == pFVar23) goto LAB_0012f80c;
      lVar25 = 0x50;
      uVar19 = 0;
      do {
        nivalis::latex_to_nivalis
                  ((string *)local_200,(string *)((long)(pFVar23->line_color).data + lVar25 + -0x20)
                  );
        std::__cxx11::string::operator=
                  ((string *)
                   ((long)(((local_238->
                            super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                            )._M_impl.super__Vector_impl_data._M_start)->line_color).data +
                   lVar25 + -0x20),(string *)local_200);
        if (local_200 != (undefined1  [8])auStack_1f0) {
          operator_delete((void *)local_200,(ulong)(auStack_1f0._0_8_ + 1));
        }
        uVar19 = uVar19 + 1;
        pFVar23 = (this->funcs).
                  super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pFVar16 = (this->funcs).
                  super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        lVar25 = lVar25 + 0x130;
      } while (uVar19 < (ulong)(((long)pFVar16 - (long)pFVar23 >> 4) * -0x79435e50d79435e5));
    }
    else {
      if (pFVar16 == pFVar23) goto LAB_0012f80c;
      lVar25 = 0x50;
      uVar19 = 0;
      do {
        nivalis_to_latex_safe
                  ((string *)local_200,(string *)((long)(pFVar23->line_color).data + lVar25 + -0x20)
                  );
        std::__cxx11::string::operator=
                  ((string *)
                   ((long)(((local_238->
                            super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                            )._M_impl.super__Vector_impl_data._M_start)->line_color).data +
                   lVar25 + -0x20),(string *)local_200);
        if (local_200 != (undefined1  [8])auStack_1f0) {
          operator_delete((void *)local_200,(ulong)(auStack_1f0._0_8_ + 1));
        }
        uVar19 = uVar19 + 1;
        pFVar23 = (this->funcs).
                  super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pFVar16 = (this->funcs).
                  super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        lVar25 = lVar25 + 0x130;
      } while (uVar19 < (ulong)(((long)pFVar16 - (long)pFVar23 >> 4) * -0x79435e50d79435e5));
    }
  }
  piVar26 = local_208;
  if (pFVar16 != pFVar23) {
    sVar22 = 0;
    do {
      reparse_expr(this,sVar22);
      sVar22 = sVar22 + 1;
      pFVar23 = (this->funcs).
                super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                super__Vector_impl_data._M_start;
      pFVar16 = (this->funcs).
                super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while (sVar22 < (ulong)(((long)pFVar16 - (long)pFVar23 >> 4) * -0x79435e50d79435e5));
    if (pFVar16 != pFVar23) {
      sVar22 = 0;
      do {
        reparse_expr(this,sVar22);
        sVar22 = sVar22 + 1;
      } while (sVar22 < (ulong)(((long)(this->funcs).
                                       super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->funcs).
                                       super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4) *
                               -0x79435e50d79435e5));
    }
  }
LAB_0012f80c:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::json_value::destroy((json_value *)(local_2a8 + 8),(value_t)local_2a8[0]);
  return piVar26;
}

Assistant:

std::istream& Plotter::import_json(std::istream& is, std::string* error_msg) {
    if (error_msg) {
        error_msg->clear();
    }
    try {
        funcs.clear();

        json j; is >> j;
        if (j.is_array()) {
            // Interpret as function list
            j = json {
                {"funcs",  j}
            };
        }

        {
            // Load environment
            env.clear();
            x_var = env.addr_of("x", false);
            y_var = env.addr_of("y", false);
            t_var = env.addr_of("t", false);
            r_var = env.addr_of("r", false);
            std::ostringstream ss;
            Shell tmpshell(env, ss);
            if (j.count("shell") && j["shell"].is_array()) {
                for (auto& line : j["shell"]) {
                    if (line.is_string()) {
                        if (!tmpshell.eval_line(line.get<std::string>())) {
                            std::cout << "json_load_err " << ss.str() << "\n";
                        }
                    }
                }
            }
        }

        // Load view
        // Defaults
        polar_grid = false;
        enable_axes = enable_grid = true;
        if (j.count("view")) {
            json& jview = j["view"];
            if (jview.is_object()) {
                if (jview.count("xmin")) view.xmin = jview["xmin"].get<double>();
                if (jview.count("xmax")) view.xmax = jview["xmax"].get<double>();
                if (jview.count("xmin")) view.ymin = jview["ymin"].get<double>();
                if (jview.count("xmax")) view.ymax = jview["ymax"].get<double>();
                int old_swid = view.swid, old_shigh = view.shigh;
                if (jview.count("width")) view.swid = jview["width"].get<double>();
                if (jview.count("height")) view.shigh = jview["height"].get<double>();
                // Will resize bounds to fit screen
                // else will become too distorted
                resize(old_swid, old_shigh);
                if (jview.count("axes")) enable_axes = jview["axes"].get<bool>();
                if (jview.count("grid")) enable_grid = jview["grid"].get<bool>();
                if (jview.count("polar")) polar_grid = jview["polar"].get<bool>();
            }
        }

        // Load sliders
        sliders.clear();
        sliders_vars.clear();

        if (j.count("sliders") && j["sliders"].is_array()) {
            for (auto& slider : j["sliders"]) {
                if (!slider.is_object()) continue;
                size_t idx = sliders.size();
                sliders.emplace_back();
                if (slider.count("min"))
                    sliders[idx].lo = slider["min"].get<double>();
                if (slider.count("max"))
                    sliders[idx].hi = slider["max"].get<double>();
                if (slider.count("val")) {
                    sliders[idx].val = slider["val"].get<double>();
                }
                if (slider.count("var")) {
                    sliders[idx].var_name = slider["var"].get<std::string>();
                    update_slider_var(idx);
                    if (!slider.count("val")) {
                        sliders[idx].val = env.get(sliders[idx].var_name);
                    }
                }
            }
        }
        if (j.count("funcs") && j["funcs"].is_array()) {
            size_t idx = 0;
            for (auto& jfunc : j["funcs"]) {
                funcs.emplace_back();
                auto& f = funcs[idx];
                if (jfunc.is_object()) {
                    // Object form
                    if (jfunc.count("expr"))
                        f.expr_str = jfunc["expr"].get<std::string>();
                    if (jfunc.count("color")) {
                        auto& jcol = jfunc["color"];
                        if (jcol.is_string()) {
                            f.line_color = color::from_hex(
                                    jcol.get<std::string>());
                        } else if (jcol.is_number_integer()) {
                            f.line_color = color::from_int(
                                    (size_t)jcol.get<int>());
                        }
                    } else {
                        f.line_color = color::from_int(idx);
                        last_expr_color = idx+1;
                    }
                    if (jfunc.count("id")) {
                        int id = jfunc["id"].get<int>();
                        next_func_name = std::max(next_func_name, (size_t)id+1);
                        f.name = "f" + std::to_string(id);
                    } else {
                        f.name = "f" + std::to_string(next_func_name++);
                    }
                    if (jfunc.count("tmin")) {
                        f.tmin = jfunc["tmin"].get<double>();
                    }
                    if (jfunc.count("tmax")) {
                        f.tmax = jfunc["tmax"].get<double>();
                    }
                } else if (jfunc.is_string()) {
                    // Only expression
                    f.expr_str = jfunc.get<std::string>();
                    f.name = "f" + std::to_string(next_func_name++);
                    f.line_color = color::from_int(idx);
                    last_expr_color = idx+1;
                }
                ++idx;
            }
        } else {
            // Ensure there is at lease 1 function left
            funcs.resize(1);
            funcs[0].expr_str = "";
            funcs[0].type = Function::FUNC_TYPE_EXPLICIT;
            funcs[0].line_color = color::from_int(last_expr_color++);
            funcs[0].name = "f" + std::to_string(next_func_name++);
        }

        reuse_colors.clear();
        if (j.count("internal")) {
            json& jint = j["internal"];
            if (jint.is_object()) {
                if (jint.count("curr_func")) {
                    int cf = jint["curr_func"].get<int>();
                    if (cf < 0 || cf >= funcs.size()) {
                        set_curr_func(0);
                    } else {
                        set_curr_func(cf);
                    }
                } else {
                    set_curr_func(0);
                }
                if (jint.count("next_color")) last_expr_color =
                    jint["next_color"].get<double>();
                if (jint.count("color_queue") &&
                        jint["color_queue"].is_array()) {
                    for (auto& jcol : jint["color_queue"]) {
                        reuse_colors.push_back(color::from_hex(
                                    jcol.get<std::string>()));
                    }
                }
            }
        }
        bool imp_use_latex = false;
        if (j.count("latex")) {
            imp_use_latex = j["latex"].get<bool>() == true;
        }
        // If one save uses Nivalis expression format and the other uses LaTeX, try to convert
        if (imp_use_latex != use_latex) {
            if (use_latex) {
                for (size_t i = 0; i < funcs.size(); ++i) {
                    funcs[i].expr_str = nivalis_to_latex_safe(funcs[i].expr_str);
                }
            } else {
                for (size_t i = 0; i < funcs.size(); ++i) {
                    funcs[i].expr_str = latex_to_nivalis(funcs[i].expr_str);
                }
            }
        }
        for (size_t i = 0; i < funcs.size(); ++i) {
            reparse_expr(i);
        }
        for (size_t i = 0; i < funcs.size(); ++i) {
            // Reparse again in case of reference to other functions
            reparse_expr(i);
        }
    } catch (const json::parse_error& e) {
        if (error_msg != nullptr) {
            *error_msg = e.what();
        }
    }
    return is;
}